

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O3

int mp_cmp_mag(mp_int *a,mp_int *b)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  
  iVar4 = a->used;
  iVar3 = 1;
  if (iVar4 <= b->used) {
    if (b->used <= iVar4) {
      if (0 < iVar4) {
        uVar5 = (ulong)(iVar4 - 1);
        do {
          uVar1 = b->dp[uVar5];
          uVar2 = a->dp[uVar5];
          if (uVar2 >= uVar1 && uVar2 != uVar1) {
            return 1;
          }
          if (uVar2 < uVar1) goto LAB_001045d4;
          uVar5 = uVar5 - 1;
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
      }
      return 0;
    }
LAB_001045d4:
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int mp_cmp_mag (mp_int * a, mp_int * b)
{
  int     n;
  mp_digit *tmpa, *tmpb;

  /* compare based on # of non-zero digits */
  if (a->used > b->used) {
    return MP_GT;
  }
  
  if (a->used < b->used) {
    return MP_LT;
  }

  /* alias for a */
  tmpa = a->dp + (a->used - 1);

  /* alias for b */
  tmpb = b->dp + (a->used - 1);

  /* compare based on digits  */
  for (n = 0; n < a->used; ++n, --tmpa, --tmpb) {
    if (*tmpa > *tmpb) {
      return MP_GT;
    }

    if (*tmpa < *tmpb) {
      return MP_LT;
    }
  }
  return MP_EQ;
}